

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O1

bool absl::debugging_internal::ParseClassEnumType(State *state)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined4 uVar4;
  bool bVar5;
  ParseState copy;
  
  iVar1 = state->recursion_depth;
  iVar2 = state->steps;
  state->recursion_depth = iVar1 + 1;
  state->steps = iVar2 + 1;
  if (iVar2 < 0x20000 && iVar1 < 0x100) {
    iVar1 = (state->parse_state).mangled_idx;
    iVar2 = (state->parse_state).out_cur_idx;
    iVar3 = (state->parse_state).prev_name_idx;
    uVar4 = *(undefined4 *)&(state->parse_state).field_0xc;
    bVar5 = ParseTwoCharToken(state,"Ts");
    if (!bVar5) {
      bVar5 = ParseTwoCharToken(state,"Tu");
      if (!bVar5) {
        ParseTwoCharToken(state,"Te");
      }
    }
    bVar5 = ParseName(state);
    if (!bVar5) {
      (state->parse_state).mangled_idx = iVar1;
      (state->parse_state).out_cur_idx = iVar2;
      (state->parse_state).prev_name_idx = iVar3;
      *(undefined4 *)&(state->parse_state).field_0xc = uVar4;
    }
  }
  else {
    bVar5 = false;
  }
  state->recursion_depth = state->recursion_depth + -1;
  return bVar5;
}

Assistant:

static bool ParseClassEnumType(State *state) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;
  ParseState copy = state->parse_state;
  if (Optional(ParseTwoCharToken(state, "Ts") ||
               ParseTwoCharToken(state, "Tu") ||
               ParseTwoCharToken(state, "Te")) &&
      ParseName(state)) {
    return true;
  }
  state->parse_state = copy;
  return false;
}